

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MergePrefixLists(Fts5Index *p,Fts5Buffer *p1,int nBuf,Fts5Buffer *aBuf)

{
  long lVar1;
  PrefixMerger *pPVar2;
  int iVar3;
  int iVar4;
  long in_RCX;
  long lVar5;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Fts5DoclistIter *pI;
  PrefixMerger *pThis_1;
  PrefixMerger *pX;
  PrefixMerger *pNext;
  int nTail;
  PrefixMerger *pThis;
  PrefixMerger *pSave;
  int nMerge;
  int nTmp;
  i64 iLastRowid;
  int nOut;
  int i;
  i64 iPrev;
  Fts5Buffer tmp;
  Fts5Buffer out;
  PrefixMerger *pHead;
  PrefixMerger aMerger [16];
  Fts5DoclistIter *in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  undefined1 uVar6;
  PrefixMerger *in_stack_fffffffffffffb58;
  PrefixMerger *in_stack_fffffffffffffb60;
  PrefixMerger *in_stack_fffffffffffffb68;
  PrefixMerger *in_stack_fffffffffffffb70;
  PrefixMerger *local_478;
  int local_46c;
  int local_460;
  int local_45c;
  Fts5Buffer local_430;
  long local_420;
  int local_418;
  undefined4 uStack_414;
  PrefixMerger *local_410;
  PrefixMerger local_408 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_408,0xaa,0x400);
  local_410 = (PrefixMerger *)0x0;
  local_460 = 0;
  memset(&local_420,0,0x10);
  memset(&local_430,0,0x10);
  memset(local_408,0,(long)(in_EDX + 1) << 6);
  local_410 = local_408 + in_EDX;
  fts5DoclistIterInit((Fts5Buffer *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                      in_stack_fffffffffffffb48);
  for (local_45c = 0; local_45c < in_EDX; local_45c = local_45c + 1) {
    fts5DoclistIterInit((Fts5Buffer *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                        in_stack_fffffffffffffb48);
    fts5PrefixMergerInsertByRowid(&local_410,local_408 + local_45c);
    local_460 = *(int *)(in_RCX + (long)local_45c * 0x10 + 8) + local_460;
  }
  if ((local_460 != 0) &&
     (iVar3 = sqlite3Fts5BufferSize
                        ((int *)in_stack_fffffffffffffb68,(Fts5Buffer *)in_stack_fffffffffffffb60,
                         (u32)((ulong)in_stack_fffffffffffffb58 >> 0x20)), iVar3 == 0)) {
    while (local_410 != (PrefixMerger *)0x0) {
      iVar3 = sqlite3Fts5PutVarint((uchar *)in_stack_fffffffffffffb48,0x27ffb8);
      local_418 = iVar3 + local_418;
      lVar1 = (local_410->iter).iRowid;
      if ((local_410->pNext == (PrefixMerger *)0x0) || (lVar1 != (local_410->pNext->iter).iRowid)) {
        in_stack_fffffffffffffb58 = local_410;
        in_stack_fffffffffffffb60 = local_410;
        memcpy((void *)(local_420 + local_418),(local_410->iter).aPoslist,
               (long)((local_410->iter).nPoslist + (local_410->iter).nSize));
        local_418 = (in_stack_fffffffffffffb58->iter).nPoslist +
                    (in_stack_fffffffffffffb58->iter).nSize + local_418;
        fts5DoclistIterNext(in_stack_fffffffffffffb48);
        local_410 = in_stack_fffffffffffffb60->pNext;
        fts5PrefixMergerInsertByRowid(&local_410,in_stack_fffffffffffffb60);
      }
      else {
        local_46c = 8;
        local_478 = local_410;
        local_410 = (PrefixMerger *)0x0;
        while( true ) {
          uVar6 = false;
          if (local_478 != (PrefixMerger *)0x0) {
            uVar6 = (local_478->iter).iRowid == lVar1;
          }
          if ((bool)uVar6 == false) break;
          in_stack_fffffffffffffb70 = local_478->pNext;
          local_478->iOff = 0;
          local_478->iPos = 0;
          local_478->aPos = (local_478->iter).aPoslist + (local_478->iter).nSize;
          sqlite3Fts5PoslistNext64
                    ((u8 *)in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20)
                     ,(int *)in_stack_fffffffffffffb60,(i64 *)in_stack_fffffffffffffb58);
          local_46c = (local_478->iter).nPoslist + 10 + local_46c;
          fts5PrefixMergerInsertByPosition(&local_410,local_478);
          local_478 = in_stack_fffffffffffffb70;
        }
        if ((local_410 == (PrefixMerger *)0x0) || (local_410->pNext == (PrefixMerger *)0x0)) {
          *(undefined4 *)(in_RDI + 0x3c) = 0x10b;
          break;
        }
        iVar3 = sqlite3Fts5BufferSize
                          ((int *)in_stack_fffffffffffffb68,(Fts5Buffer *)in_stack_fffffffffffffb60,
                           (u32)((ulong)in_stack_fffffffffffffb58 >> 0x20));
        if (iVar3 != 0) break;
        sqlite3Fts5BufferZero(&local_430);
        pPVar2 = local_410;
        local_410 = local_410->pNext;
        sqlite3Fts5PoslistSafeAppend
                  ((Fts5Buffer *)CONCAT17(uVar6,in_stack_fffffffffffffb50),
                   (i64 *)in_stack_fffffffffffffb48,0x2801c6);
        sqlite3Fts5PoslistNext64
                  ((u8 *)in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                   (int *)in_stack_fffffffffffffb60,(i64 *)in_stack_fffffffffffffb58);
        fts5PrefixMergerInsertByPosition(&local_410,pPVar2);
        while (pPVar2 = local_410, local_410->pNext != (PrefixMerger *)0x0) {
          if (local_410->iPos != 0) {
            sqlite3Fts5PoslistSafeAppend
                      ((Fts5Buffer *)CONCAT17(uVar6,in_stack_fffffffffffffb50),
                       (i64 *)in_stack_fffffffffffffb48,0x280251);
          }
          sqlite3Fts5PoslistNext64
                    ((u8 *)in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20)
                     ,(int *)in_stack_fffffffffffffb60,(i64 *)in_stack_fffffffffffffb58);
          local_410 = pPVar2->pNext;
          fts5PrefixMergerInsertByPosition(&local_410,pPVar2);
        }
        if (local_410->iPos != 0) {
          sqlite3Fts5PoslistSafeAppend
                    ((Fts5Buffer *)CONCAT17(uVar6,in_stack_fffffffffffffb50),
                     (i64 *)in_stack_fffffffffffffb48,0x2802d8);
        }
        iVar3 = (local_410->iter).nPoslist - local_410->iOff;
        if (local_46c + -8 < local_430.n + iVar3) {
          if (*(int *)(in_RDI + 0x3c) == 0) {
            *(undefined4 *)(in_RDI + 0x3c) = 0x10b;
          }
          break;
        }
        iVar4 = sqlite3Fts5PutVarint((uchar *)in_stack_fffffffffffffb48,0x28034c);
        local_418 = iVar4 + local_418;
        memcpy((void *)(local_420 + local_418),local_430.p,(long)local_430.n);
        local_418 = local_430.n + local_418;
        if (0 < iVar3) {
          memcpy((void *)(local_420 + local_418),local_410->aPos + local_410->iOff,(long)iVar3);
          local_418 = iVar3 + local_418;
        }
        local_410 = local_478;
        for (local_45c = 0; local_45c < in_EDX + 1; local_45c = local_45c + 1) {
          lVar5 = (long)local_45c;
          in_stack_fffffffffffffb68 = local_408 + lVar5;
          if ((local_408[lVar5].iter.aPoslist != (u8 *)0x0) &&
             (local_408[lVar5].iter.iRowid == lVar1)) {
            fts5DoclistIterNext(in_stack_fffffffffffffb48);
            fts5PrefixMergerInsertByRowid(&local_410,in_stack_fffffffffffffb68);
          }
        }
      }
    }
    sqlite3Fts5BufferFree((Fts5Buffer *)0x280516);
    sqlite3Fts5BufferFree((Fts5Buffer *)0x280523);
    memset((void *)(local_420 + local_418),0,8);
    *in_RSI = local_420;
    in_RSI[1] = CONCAT44(uStack_414,local_418);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts5MergePrefixLists(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Buffer *p1,                 /* First list to merge */
  int nBuf,                       /* Number of buffers in array aBuf[] */
  Fts5Buffer *aBuf                /* Other lists to merge in */
){
#define fts5PrefixMergerNextPosition(p) \
  sqlite3Fts5PoslistNext64((p)->aPos,(p)->iter.nPoslist,&(p)->iOff,&(p)->iPos)
#define FTS5_MERGE_NLIST 16
  PrefixMerger aMerger[FTS5_MERGE_NLIST];
  PrefixMerger *pHead = 0;
  int i;
  int nOut = 0;
  Fts5Buffer out = {0, 0, 0};
  Fts5Buffer tmp = {0, 0, 0};
  i64 iLastRowid = 0;

  /* Initialize a doclist-iterator for each input buffer. Arrange them in
  ** a linked-list starting at pHead in ascending order of rowid. Avoid
  ** linking any iterators already at EOF into the linked list at all. */
  assert( nBuf+1<=(int)(sizeof(aMerger)/sizeof(aMerger[0])) );
  memset(aMerger, 0, sizeof(PrefixMerger)*(nBuf+1));
  pHead = &aMerger[nBuf];
  fts5DoclistIterInit(p1, &pHead->iter);
  for(i=0; i<nBuf; i++){
    fts5DoclistIterInit(&aBuf[i], &aMerger[i].iter);
    fts5PrefixMergerInsertByRowid(&pHead, &aMerger[i]);
    nOut += aBuf[i].n;
  }
  if( nOut==0 ) return;
  nOut += p1->n + 9 + 10*nBuf;

  /* The maximum size of the output is equal to the sum of the
  ** input sizes + 1 varint (9 bytes). The extra varint is because if the
  ** first rowid in one input is a large negative number, and the first in
  ** the other a non-negative number, the delta for the non-negative
  ** number will be larger on disk than the literal integer value
  ** was.
  **
  ** Or, if the input position-lists are corrupt, then the output might
  ** include up to (nBuf+1) extra 10-byte positions created by interpreting -1
  ** (the value PoslistNext64() uses for EOF) as a position and appending
  ** it to the output. This can happen at most once for each input
  ** position-list, hence (nBuf+1) 10 byte paddings.  */
  if( sqlite3Fts5BufferSize(&p->rc, &out, nOut) ) return;

  while( pHead ){
    fts5MergeAppendDocid(&out, iLastRowid, pHead->iter.iRowid);

    if( pHead->pNext && iLastRowid==pHead->pNext->iter.iRowid ){
      /* Merge data from two or more poslists */
      i64 iPrev = 0;
      int nTmp = FTS5_DATA_ZERO_PADDING;
      int nMerge = 0;
      PrefixMerger *pSave = pHead;
      PrefixMerger *pThis = 0;
      int nTail = 0;

      pHead = 0;
      while( pSave && pSave->iter.iRowid==iLastRowid ){
        PrefixMerger *pNext = pSave->pNext;
        pSave->iOff = 0;
        pSave->iPos = 0;
        pSave->aPos = &pSave->iter.aPoslist[pSave->iter.nSize];
        fts5PrefixMergerNextPosition(pSave);
        nTmp += pSave->iter.nPoslist + 10;
        nMerge++;
        fts5PrefixMergerInsertByPosition(&pHead, pSave);
        pSave = pNext;
      }

      if( pHead==0 || pHead->pNext==0 ){
        p->rc = FTS5_CORRUPT;
        break;
      }

      /* See the earlier comment in this function for an explanation of why
      ** corrupt input position lists might cause the output to consume
      ** at most nMerge*10 bytes of unexpected space. */
      if( sqlite3Fts5BufferSize(&p->rc, &tmp, nTmp+nMerge*10) ){
        break;
      }
      fts5BufferZero(&tmp);

      pThis = pHead;
      pHead = pThis->pNext;
      sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, pThis->iPos);
      fts5PrefixMergerNextPosition(pThis);
      fts5PrefixMergerInsertByPosition(&pHead, pThis);

      while( pHead->pNext ){
        pThis = pHead;
        if( pThis->iPos!=iPrev ){
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, pThis->iPos);
        }
        fts5PrefixMergerNextPosition(pThis);
        pHead = pThis->pNext;
        fts5PrefixMergerInsertByPosition(&pHead, pThis);
      }

      if( pHead->iPos!=iPrev ){
        sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, pHead->iPos);
      }
      nTail = pHead->iter.nPoslist - pHead->iOff;

      /* WRITEPOSLISTSIZE */
      assert_nc( tmp.n+nTail<=nTmp );
      assert( tmp.n+nTail<=nTmp+nMerge*10 );
      if( tmp.n+nTail>nTmp-FTS5_DATA_ZERO_PADDING ){
        if( p->rc==SQLITE_OK ) p->rc = FTS5_CORRUPT;
        break;
      }
      fts5BufferSafeAppendVarint(&out, (tmp.n+nTail) * 2);
      fts5BufferSafeAppendBlob(&out, tmp.p, tmp.n);
      if( nTail>0 ){
        fts5BufferSafeAppendBlob(&out, &pHead->aPos[pHead->iOff], nTail);
      }

      pHead = pSave;
      for(i=0; i<nBuf+1; i++){
        PrefixMerger *pX = &aMerger[i];
        if( pX->iter.aPoslist && pX->iter.iRowid==iLastRowid ){
          fts5DoclistIterNext(&pX->iter);
          fts5PrefixMergerInsertByRowid(&pHead, pX);
        }
      }

    }else{
      /* Copy poslist from pHead to output */
      PrefixMerger *pThis = pHead;
      Fts5DoclistIter *pI = &pThis->iter;
      fts5BufferSafeAppendBlob(&out, pI->aPoslist, pI->nPoslist+pI->nSize);
      fts5DoclistIterNext(pI);
      pHead = pThis->pNext;
      fts5PrefixMergerInsertByRowid(&pHead, pThis);
    }
  }

  fts5BufferFree(p1);
  fts5BufferFree(&tmp);
  memset(&out.p[out.n], 0, FTS5_DATA_ZERO_PADDING);
  *p1 = out;
}